

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::set<int>
          (action_provider<clipp::parameter> *this,int *t)

{
  parameter *ppVar1;
  map_arg_to<int> local_40;
  arg_action local_38;
  int *local_18;
  int *t_local;
  action_provider<clipp::parameter> *this_local;
  
  local_18 = t;
  t_local = (int *)this;
  local_40 = clipp::set<int>(t);
  std::function<void(char_const*)>::function<clipp::detail::map_arg_to<int>,void>
            ((function<void(char_const*)> *)&local_38,&local_40);
  ppVar1 = call(this,&local_38);
  std::function<void_(const_char_*)>::~function(&local_38);
  return ppVar1;
}

Assistant:

Derived&
    set(Target& t) {
        static_assert(!std::is_pointer<Target>::value,
                      "parameter target type must not be a pointer");

        return call(clipp::set(t));
    }